

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.h
# Opt level: O3

BBlockInfo * __thiscall
dg::dda::MemorySSATransformation::getBBlockInfo(MemorySSATransformation *this,RWBBlock *b)

{
  const_iterator cVar1;
  const_iterator cVar2;
  BBlockInfo *pBVar3;
  key_type local_10;
  
  local_10 = *(key_type *)(b + 0x50);
  cVar1 = std::
          _Hashtable<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(this + 0x128),&local_10);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    pBVar3 = (BBlockInfo *)0x0;
  }
  else {
    local_10 = (key_type)b;
    cVar2 = std::
            _Hashtable<dg::dda::RWBBlock_*,_std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>,_std::allocator<std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWBBlock_*>,_std::hash<dg::dda::RWBBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<dg::dda::RWBBlock_*,_std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>,_std::allocator<std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWBBlock_*>,_std::hash<dg::dda::RWBBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)cVar1.
                             super__Node_iterator_base<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_false>
                             ._M_cur + 0x10),(key_type *)&local_10);
    pBVar3 = (BBlockInfo *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>,_false>
                    ._M_cur + 0x10);
    if (cVar2.
        super__Node_iterator_base<std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>,_false>
        ._M_cur == (__node_type *)0x0) {
      pBVar3 = (BBlockInfo *)0x0;
    }
  }
  return pBVar3;
}

Assistant:

const BBlockInfo *getBBlockInfo(RWBBlock *b) const {
        const auto *si = getSubgraphInfo(b->getSubgraph());
        if (si) {
            return si->getBBlockInfo(b);
        }
        return nullptr;
    }